

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O1

void __thiscall Salsa20Cipher::setKey(Salsa20Cipher *this,uint8_t *key,size_t keySize)

{
  uint uVar1;
  uint uVar2;
  uint8_t paddedKey [32];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined8 uStack_20;
  
  local_38 = 0;
  uStack_30 = 0;
  uStack_28 = 0;
  uStack_20 = 0;
  if (keySize != 0) {
    memcpy(&local_38,key,keySize);
  }
  (this->m_state)._M_elems[0] = 0x61707865;
  (this->m_state)._M_elems[1] = (uint)(byte)local_38;
  (this->m_state)._M_elems[1] = (uint)(ushort)local_38;
  (this->m_state)._M_elems[1] = (uint)(uint3)local_38;
  (this->m_state)._M_elems[1] = (uint)local_38;
  (this->m_state)._M_elems[2] = (uint)local_38._4_1_;
  (this->m_state)._M_elems[2] = (uint)(ushort)((ulong)local_38 >> 0x20);
  (this->m_state)._M_elems[2] = (uint)(uint3)((ulong)local_38 >> 0x20);
  uVar1 = (uint)((ulong)local_38 >> 0x20);
  (this->m_state)._M_elems[2] = uVar1;
  (this->m_state)._M_elems[3] = (uint)(byte)uStack_30;
  (this->m_state)._M_elems[3] = (uint)(ushort)uStack_30;
  (this->m_state)._M_elems[3] = (uint)(uint3)uStack_30;
  (this->m_state)._M_elems[3] = (uint)uStack_30;
  (this->m_state)._M_elems[4] = (uint)uStack_30._4_1_;
  (this->m_state)._M_elems[4] = (uint)(ushort)((ulong)uStack_30 >> 0x20);
  (this->m_state)._M_elems[4] = (uint)(uint3)((ulong)uStack_30 >> 0x20);
  uVar2 = (uint)((ulong)uStack_30 >> 0x20);
  (this->m_state)._M_elems[4] = uVar2;
  if (keySize < 0x11) {
    (this->m_state)._M_elems[5] = 0x3120646e;
    (this->m_state)._M_elems[10] = 0x79622d36;
    (this->m_state)._M_elems[0xb] = (uint)local_38;
    (this->m_state)._M_elems[0xc] = uVar1;
    (this->m_state)._M_elems[0xd] = (uint)uStack_30;
    (this->m_state)._M_elems[0xe] = uVar2;
  }
  else {
    (this->m_state)._M_elems[5] = 0x3320646e;
    (this->m_state)._M_elems[10] = 0x79622d32;
    (this->m_state)._M_elems[0xb] = (uint)(byte)uStack_28;
    (this->m_state)._M_elems[0xb] = (uint)(ushort)uStack_28;
    (this->m_state)._M_elems[0xb] = (uint)(uint3)uStack_28;
    (this->m_state)._M_elems[0xb] = (uint)uStack_28;
    (this->m_state)._M_elems[0xc] = (uint)uStack_28._4_1_;
    (this->m_state)._M_elems[0xc] = (uint)(ushort)((ulong)uStack_28 >> 0x20);
    (this->m_state)._M_elems[0xc] = (uint)(uint3)((ulong)uStack_28 >> 0x20);
    (this->m_state)._M_elems[0xc] = (uint)((ulong)uStack_28 >> 0x20);
    (this->m_state)._M_elems[0xd] = (uint)(byte)uStack_20;
    (this->m_state)._M_elems[0xd] = (uint)(ushort)uStack_20;
    (this->m_state)._M_elems[0xd] = (uint)(uint3)uStack_20;
    (this->m_state)._M_elems[0xd] = (uint)uStack_20;
    (this->m_state)._M_elems[0xe] = (uint)uStack_20._4_1_;
    (this->m_state)._M_elems[0xe] = (uint)(ushort)((ulong)uStack_20 >> 0x20);
    (this->m_state)._M_elems[0xe] = (uint)(uint3)((ulong)uStack_20 >> 0x20);
    (this->m_state)._M_elems[0xe] = (uint)((ulong)uStack_20 >> 0x20);
  }
  (this->m_state)._M_elems[0xf] = 0x6b206574;
  return;
}

Assistant:

void setKey(const uint8_t key[KEY_MAX_SIZE], size_t keySize)
	{
		const auto sz = sizeof(uint32_t);
		
		uint8_t paddedKey[KEY_MAX_SIZE] = { 0 };
		std::copy(key, key + keySize, paddedKey);
		
		if (keySize > KEY_MAX_SIZE / 2) {
			static const auto magic = reinterpret_cast<const uint8_t*>("expand 32-byte k");
			
			bytesToUint(magic + 0 * sz, m_state[0]);
			bytesToUint(paddedKey + 0 * sz, m_state[1]);
			bytesToUint(paddedKey + 1 * sz, m_state[2]);
			bytesToUint(paddedKey + 2 * sz, m_state[3]);
			bytesToUint(paddedKey + 3 * sz, m_state[4]);
			bytesToUint(magic + 1 * sz, m_state[5]);
			bytesToUint(magic + 2 * sz, m_state[10]);
			bytesToUint(paddedKey + 4 * sz, m_state[11]);
			bytesToUint(paddedKey + 5 * sz, m_state[12]);
			bytesToUint(paddedKey + 6 * sz, m_state[13]);
			bytesToUint(paddedKey + 7 * sz, m_state[14]);
			bytesToUint(magic + 3 * sz, m_state[15]);
		} else {
			static const auto magic = reinterpret_cast<const uint8_t*>("expand 16-byte k");
			
			bytesToUint(magic + 0 * sz, m_state[0]);
			bytesToUint(paddedKey + 0 * sz, m_state[1]);
			bytesToUint(paddedKey + 1 * sz, m_state[2]);
			bytesToUint(paddedKey + 2 * sz, m_state[3]);
			bytesToUint(paddedKey + 3 * sz, m_state[4]);
			bytesToUint(magic + 1 * sz, m_state[5]);
			bytesToUint(magic + 2 * sz, m_state[10]);
			bytesToUint(paddedKey + 0 * sz, m_state[11]);
			bytesToUint(paddedKey + 1 * sz, m_state[12]);
			bytesToUint(paddedKey + 2 * sz, m_state[13]);
			bytesToUint(paddedKey + 3 * sz, m_state[14]);
			bytesToUint(magic + 3 * sz, m_state[15]);
		}
	}